

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void set_bottom_pointers(j_decompress_ptr cinfo)

{
  jpeg_d_main_controller *pjVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  JSAMPARRAY xbuf;
  jpeg_component_info *compptr;
  int rows_left;
  int iMCUheight;
  int rgroup;
  int i;
  int ci;
  my_main_ptr_conflict main_ptr;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->main;
  ci = 0;
  compptr = cinfo->comp_info;
  for (; ci < cinfo->num_components; ci = ci + 1) {
    uVar3 = compptr->v_samp_factor * compptr->DCT_scaled_size;
    iVar4 = (int)uVar3 / cinfo->min_DCT_scaled_size;
    rows_left = compptr->downsampled_height % uVar3;
    if (rows_left == 0) {
      rows_left = uVar3;
    }
    if (ci == 0) {
      *(int *)&pjVar1[8].start_pass = (rows_left + -1) / iVar4 + 1;
    }
    lVar2 = *(long *)((&pjVar1[6].process_data)[*(int *)&pjVar1[7].process_data] + (long)ci * 8);
    for (i = 0; SBORROW4(i,iVar4 * 2) != i + iVar4 * -2 < 0; i = i + 1) {
      *(undefined8 *)(lVar2 + (long)(rows_left + i) * 8) =
           *(undefined8 *)(lVar2 + (long)(rows_left + -1) * 8);
    }
    compptr = compptr + 1;
  }
  return;
}

Assistant:

LOCAL(void)
set_bottom_pointers(j_decompress_ptr cinfo)
/* Change the pointer lists to duplicate the last sample row at the bottom
 * of the image.  whichptr indicates which xbuffer holds the final iMCU row.
 * Also sets rowgroups_avail to indicate number of nondummy row groups in row.
 */
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  int ci, i, rgroup, iMCUheight, rows_left;
  jpeg_component_info *compptr;
  JSAMPARRAY xbuf;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Count sample rows in one iMCU row and in one row group */
    iMCUheight = compptr->v_samp_factor * compptr->_DCT_scaled_size;
    rgroup = iMCUheight / cinfo->_min_DCT_scaled_size;
    /* Count nondummy sample rows remaining for this component */
    rows_left = (int)(compptr->downsampled_height % (JDIMENSION)iMCUheight);
    if (rows_left == 0) rows_left = iMCUheight;
    /* Count nondummy row groups.  Should get same answer for each component,
     * so we need only do it once.
     */
    if (ci == 0) {
      main_ptr->rowgroups_avail = (JDIMENSION)((rows_left - 1) / rgroup + 1);
    }
    /* Duplicate the last real sample row rgroup*2 times; this pads out the
     * last partial rowgroup and ensures at least one full rowgroup of context.
     */
    xbuf = main_ptr->xbuffer[main_ptr->whichptr][ci];
    for (i = 0; i < rgroup * 2; i++) {
      xbuf[rows_left + i] = xbuf[rows_left - 1];
    }
  }
}